

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_add(REF_CELL ref_cell,REF_INT *nodes,REF_INT *new_cell)

{
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  REF_STATUS RVar12;
  
  *new_cell = -1;
  if (ref_cell->blank == -1) {
    iVar1 = ref_cell->max;
    if (iVar1 == 0x1fffffff) {
      pcVar11 = "the number of cells is too large for integers, cannot grow";
      uVar9 = 0x2a8;
    }
    else {
      if (iVar1 < 0x1fffffff) {
        iVar7 = 5000;
        if (5000 < (int)((double)iVar1 * 1.5)) {
          iVar7 = (int)((double)iVar1 * 1.5);
        }
        if (0x1fffffff - iVar1 <= iVar7) {
          iVar7 = 0x1fffffff - iVar1;
        }
        ref_cell->max = iVar7 + iVar1;
        fflush(_stdout);
        uVar2 = ref_cell->max * ref_cell->size_per;
        if (0 < (int)uVar2) {
          pRVar3 = (REF_INT *)realloc(ref_cell->c2n,(ulong)uVar2 << 2);
          ref_cell->c2n = pRVar3;
        }
        pRVar3 = ref_cell->c2n;
        if (pRVar3 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x2b4,"ref_cell_add","realloc ref_cell->c2n NULL");
          uVar10 = (long)ref_cell->max * (long)ref_cell->size_per;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar10 & 0xffffffff,
                 uVar10,4,uVar10 * 4);
          return 2;
        }
        iVar7 = ref_cell->max;
        iVar4 = iVar1;
        if (iVar1 < iVar7) {
          do {
            pRVar3[(long)ref_cell->size_per * (long)iVar4] = -1;
            iVar5 = iVar4 + 1;
            pRVar3[(long)ref_cell->size_per * (long)iVar4 + 1] = iVar5;
            iVar7 = ref_cell->max;
            iVar4 = iVar5;
          } while (iVar5 < iVar7);
        }
        pRVar3[((long)iVar7 + -1) * (long)ref_cell->size_per + 1] = -1;
        ref_cell->blank = iVar1;
        goto LAB_00124415;
      }
      pcVar11 = "chunk limit at max";
      uVar9 = 0x2ae;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar9,
           "ref_cell_add",pcVar11);
    RVar12 = 1;
  }
  else {
LAB_00124415:
    iVar1 = ref_cell->blank;
    pRVar3 = ref_cell->c2n;
    lVar6 = (long)ref_cell->size_per;
    ref_cell->blank = pRVar3[iVar1 * lVar6 + 1];
    if (0 < lVar6) {
      lVar8 = 0;
      do {
        pRVar3[(int)lVar6 * iVar1 + lVar8] = nodes[lVar8];
        lVar8 = lVar8 + 1;
        lVar6 = (long)ref_cell->size_per;
      } while (lVar8 < lVar6);
    }
    if (0 < ref_cell->node_per) {
      lVar6 = 0;
      pRVar3 = new_cell;
      do {
        uVar2 = ref_adj_add(ref_cell->ref_adj,nodes[lVar6],iVar1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x2c4,"ref_cell_add",(ulong)uVar2,"register cell");
          pRVar3 = (REF_INT *)(ulong)uVar2;
        }
        if (uVar2 != 0) {
          return (REF_STATUS)pRVar3;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < ref_cell->node_per);
    }
    ref_cell->n = ref_cell->n + 1;
    *new_cell = iVar1;
    RVar12 = 0;
  }
  return RVar12;
}

Assistant:

REF_FCN REF_STATUS ref_cell_add(REF_CELL ref_cell, REF_INT *nodes,
                                REF_INT *new_cell) {
  REF_INT node, cell;
  REF_INT orig, chunk;
  REF_INT max_limit = REF_INT_MAX / 4;

  (*new_cell) = REF_EMPTY;

  if (REF_EMPTY == ref_cell_blank(ref_cell)) {
    RAS(ref_cell_max(ref_cell) != max_limit,
        "the number of cells is too large for integers, cannot grow");
    orig = ref_cell_max(ref_cell);
    /* geometric growth for efficiency */
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));

    /* try to keep under 32-bit limit */
    RAS(max_limit - orig > 0, "chunk limit at max");
    chunk = MIN(chunk, max_limit - orig);

    ref_cell_max(ref_cell) = orig + chunk;

    ref_realloc(ref_cell->c2n,
                ref_cell_size_per(ref_cell) * ref_cell_max(ref_cell), REF_INT);

    for (cell = orig; cell < ref_cell_max(ref_cell); cell++) {
      ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
      ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
    }
    ref_cell_c2n(ref_cell, 1, ref_cell_max(ref_cell) - 1) = REF_EMPTY;
    ref_cell_blank(ref_cell) = orig;
  }

  cell = ref_cell_blank(ref_cell);
  ref_cell_blank(ref_cell) = ref_cell_c2n(ref_cell, 1, cell);
  for (node = 0; node < ref_cell_size_per(ref_cell); node++)
    ref_cell_c2n(ref_cell, node, cell) = nodes[node];

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    RSS(ref_adj_add(ref_cell->ref_adj, nodes[node], cell), "register cell");

  ref_cell_n(ref_cell)++;

  (*new_cell) = cell;

  return REF_SUCCESS;
}